

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackNSISGenerator::CreateComponentGroupDescription_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackNSISGenerator *this,cmCPackComponentGroup *group,
          ostream *macrosOut)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmCPackComponent *component;
  byte bVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  cmCPackComponentGroup *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((group->Components).
       super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (group->Components).
       super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((group->Subgroups).
      super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (group->Subgroups).
      super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SectionGroup ",(allocator<char> *)&bStack_b8);
    bVar3 = group->field_0x60;
    if ((bVar3 & 2) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar3 = group->field_0x60;
    }
    if ((bVar3 & 1) == 0) {
      std::operator+(&local_90,"\"",&group->DisplayName);
      std::operator+(&local_70,&local_90,"\" ");
      std::operator+(&local_50,&local_70,&group->Name);
      std::operator+(&bStack_b8,&local_50,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      std::operator+(&local_90,"\"!",&group->DisplayName);
      std::operator+(&local_70,&local_90,"\" ");
      std::operator+(&local_50,&local_70,&group->Name);
      std::operator+(&bStack_b8,&local_50,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    ppcVar1 = (group->Subgroups).
              super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_98 = group;
    for (ppcVar4 = (group->Subgroups).
                   super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
        ppcVar4 = ppcVar4 + 1) {
      CreateComponentGroupDescription_abi_cxx11_(&bStack_b8,this,*ppcVar4,macrosOut);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_b8);
    }
    ppcVar2 = (local_98->Components).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar5 = (local_98->Components).
                   super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar2;
        ppcVar5 = ppcVar5 + 1) {
      component = *ppcVar5;
      if ((component->Files).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (component->Files).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        CreateComponentDescription_abi_cxx11_(&bStack_b8,this,component,macrosOut);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&bStack_b8);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackNSISGenerator::CreateComponentGroupDescription(
  cmCPackComponentGroup* group, std::ostream& macrosOut)
{
  if (group->Components.empty() && group->Subgroups.empty()) {
    // Silently skip empty groups. NSIS doesn't support them.
    return std::string();
  }

  std::string code = "SectionGroup ";
  if (group->IsExpandedByDefault) {
    code += "/e ";
  }
  if (group->IsBold) {
    code += "\"!" + group->DisplayName + "\" " + group->Name + "\n";
  } else {
    code += "\"" + group->DisplayName + "\" " + group->Name + "\n";
  }

  for (cmCPackComponentGroup* g : group->Subgroups) {
    code += this->CreateComponentGroupDescription(g, macrosOut);
  }

  for (cmCPackComponent* comp : group->Components) {
    if (comp->Files.empty()) {
      continue;
    }

    code += this->CreateComponentDescription(comp, macrosOut);
  }
  code += "SectionGroupEnd\n";
  return code;
}